

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O1

void tcache_cleanup(tsd_t *tsd)

{
  if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled == true) {
    tcache_destroy(tsd,&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache,true);
    return;
  }
  return;
}

Assistant:

void
tcache_cleanup(tsd_t *tsd) {
	tcache_t *tcache = tsd_tcachep_get(tsd);
	if (!tcache_available(tsd)) {
		assert(tsd_tcache_enabled_get(tsd) == false);
		if (config_debug) {
			assert(tcache_small_bin_get(tcache, 0)->avail == NULL);
		}
		return;
	}
	assert(tsd_tcache_enabled_get(tsd));
	assert(tcache_small_bin_get(tcache, 0)->avail != NULL);

	tcache_destroy(tsd, tcache, true);
	if (config_debug) {
		tcache_small_bin_get(tcache, 0)->avail = NULL;
	}
}